

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * cmsys::RemoveTrailingSlashes(string *inName,char (*param_2) [4096],string *string_buffer)

{
  int iVar1;
  long lVar2;
  ulong __n;
  size_t last;
  char *name;
  size_t length;
  string *string_buffer_local;
  char (*local_buffer_local) [4096];
  string *inName_local;
  
  lVar2 = std::__cxx11::string::size();
  last = std::__cxx11::string::c_str();
  __n = lVar2 - 1;
  if (((__n != 0) &&
      (((*(char *)(last + __n) == '/' || (*(char *)(last + __n) == '\\')) &&
       (iVar1 = strcmp((char *)last,"/"), iVar1 != 0)))) && (*(char *)(last + lVar2 + -2) != ':')) {
    if (__n < 0x1000) {
      memcpy(param_2,(void *)last,__n);
      param_2[-1][lVar2 + 0xfff] = '\0';
      last = (size_t)param_2;
    }
    else {
      std::__cxx11::string::append((char *)string_buffer,last);
      last = std::__cxx11::string::c_str();
    }
  }
  return (char *)last;
}

Assistant:

static const char* RemoveTrailingSlashes(
  const std::string& inName, char (&local_buffer)[KWSYS_SYSTEMTOOLS_MAXPATH],
  std::string& string_buffer)
{
  size_t length = inName.size();
  const char* name = inName.c_str();

  size_t last = length - 1;
  if (last > 0 && (name[last] == '/' || name[last] == '\\') &&
      strcmp(name, "/") != 0 && name[last - 1] != ':') {
    if (last < sizeof(local_buffer)) {
      memcpy(local_buffer, name, last);
      local_buffer[last] = '\0';
      name = local_buffer;
    } else {
      string_buffer.append(name, last);
      name = string_buffer.c_str();
    }
  }

  return name;
}